

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

If * __thiscall MixedArena::alloc<wasm::If>(MixedArena *this)

{
  If *pIVar1;
  
  pIVar1 = (If *)allocSpace(this,0x28,8);
  (pIVar1->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression._id = IfId;
  (pIVar1->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.type.id = 0;
  pIVar1->ifFalse = (Expression *)0x0;
  return pIVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }